

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingFetchRow<unsigned_char>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  data_t dVar2;
  unsigned_long skip_count;
  long lVar3;
  uint8_t *in;
  uchar multiplier;
  BitpackingScanState<unsigned_char,_signed_char> scan_state;
  uint8_t local_889;
  idx_t local_888;
  BitpackingScanState<unsigned_char,_signed_char> local_880;
  
  BitpackingScanState<unsigned_char,_signed_char>::BitpackingScanState(&local_880,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  BitpackingScanState<unsigned_char,_signed_char>::Skip(&local_880,segment,skip_count);
  pdVar1 = result->data;
  if (local_880.current_group.mode == CONSTANT_DELTA) {
    TryCast::Operation<unsigned_long,unsigned_char>(local_880.current_group_offset,&local_889,false)
    ;
    local_880.current_constant =
         local_880.current_constant * local_889 + local_880.current_frame_of_reference;
  }
  else if (local_880.current_group.mode != CONSTANT) {
    in = local_880.current_group_ptr +
         ((local_880.current_group_offset & 0xffffffffffffffe0) * (ulong)local_880.current_width >>
         3);
    lVar3 = 0;
    local_888 = result_idx;
    do {
      duckdb_fastpforlib::internal::fastunpack_quarter
                (in,local_880.decompression_buffer + lVar3,(uint)local_880.current_width);
      lVar3 = lVar3 + 8;
      in = in + local_880.current_width;
    } while (lVar3 != 0x20);
    dVar2 = local_880.decompression_buffer[(uint)local_880.current_group_offset & 0x1f];
    pdVar1[local_888] = dVar2;
    dVar2 = dVar2 + local_880.current_frame_of_reference;
    pdVar1[local_888] = dVar2;
    if (local_880.current_group.mode == DELTA_FOR) {
      pdVar1[local_888] = dVar2 + local_880.current_delta_offset;
    }
    goto LAB_017252ad;
  }
  pdVar1[result_idx] = local_880.current_constant;
LAB_017252ad:
  local_880.super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__BitpackingScanState_0246f998;
  BufferHandle::~BufferHandle(&local_880.handle);
  return;
}

Assistant:

void BitpackingFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                        idx_t result_idx) {
	BitpackingScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	D_ASSERT(scan_state.current_group_offset < BITPACKING_METADATA_GROUP_SIZE);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	T *result_data = FlatVector::GetData<T>(result);
	T *current_result_ptr = result_data + result_idx;

	idx_t offset_in_compression_group =
	    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	data_ptr_t decompression_group_start_pointer =
	    scan_state.current_group_ptr +
	    (scan_state.current_group_offset - offset_in_compression_group) * scan_state.current_width / 8;

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
		*current_result_ptr = scan_state.current_constant;
		return;
	}

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
		T multiplier;
		auto cast = TryCast::Operation<idx_t, T>(scan_state.current_group_offset, multiplier);
		(void)cast;
		D_ASSERT(cast);
#ifdef DEBUG
		// overflow check
		T result;
		bool multiply = TryMultiplyOperator::Operation(multiplier, scan_state.current_constant, result);
		bool add = TryAddOperator::Operation(result, scan_state.current_frame_of_reference, result);
		D_ASSERT(multiply && add);
#endif
		*current_result_ptr = (multiplier * scan_state.current_constant) + scan_state.current_frame_of_reference;
		return;
	}

	D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
	         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

	BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
	                                     decompression_group_start_pointer, scan_state.current_width, skip_sign_extend);

	*current_result_ptr = scan_state.decompression_buffer[offset_in_compression_group];
	*current_result_ptr += scan_state.current_frame_of_reference;

	if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
		*current_result_ptr += scan_state.current_delta_offset;
	}
}